

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t b_find_last_key(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t *rec)

{
  ion_bpp_err_t iVar1;
  bool bVar2;
  ion_bpp_h_node_t *h;
  ion_bpp_buffer_t *buf;
  ion_bpp_external_address_t *piStack_28;
  ion_bpp_err_t rc;
  ion_bpp_external_address_t *rec_local;
  void *key_local;
  ion_bpp_handle_t handle_local;
  
  h = (ion_bpp_h_node_t *)((long)handle + 0x20);
  piStack_28 = rec;
  rec_local = (ion_bpp_external_address_t *)key;
  key_local = handle;
  while( true ) {
    if ((*(ushort *)h->comp & 1) != 0) {
      bVar2 = *(ushort *)h->comp >> 1 != 0;
      if (bVar2) {
        memcpy(rec_local,
               h->comp + (long)(int)(((*(ushort *)h->comp >> 1) - 1) * *(int *)((long)handle + 0xbc)
                                    ) + 0x20,(long)*(int *)((long)handle + 8));
        *piStack_28 = *(ion_bpp_external_address_t *)
                       (h->comp +
                       (long)*(int *)((long)handle + 8) +
                       (long)(int)(((*(ushort *)h->comp >> 1) - 1) * *(int *)((long)handle + 0xbc))
                       + 0x20);
        *(ion_bpp_h_node_t **)((long)handle + 0xa8) = h;
        *(ion_bpp_comparison_t *)((long)handle + 0xb0) =
             h->comp + (long)(int)(((*(ushort *)h->comp >> 1) - 1) * *(int *)((long)handle + 0xbc))
                       + 0x20;
      }
      handle_local._4_4_ = (ion_bpp_err_t)!bVar2;
      return handle_local._4_4_;
    }
    iVar1 = readDisk(key_local,
                     *(ion_bpp_address_t *)
                      (h->comp +
                      (long)*(int *)((long)handle + 8) +
                      (long)(int)(((*(ushort *)h->comp >> 1) - 1) * *(int *)((long)handle + 0xbc)) +
                      0x28),(ion_bpp_buffer_t **)&h);
    if (iVar1 != bErrOk) break;
    buf._4_4_ = 0;
  }
  return iVar1;
}

Assistant:

ion_bpp_err_t
b_find_last_key(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	*rec
) {
	ion_bpp_err_t		rc;			/* return code */
	ion_bpp_buffer_t	*buf;				/* buffer */

	ion_bpp_h_node_t *h = handle;

	buf = &h->root;

	while (!leaf(buf)) {
		if ((rc = readDisk(handle, childGE(lkey(buf)), &buf)) != 0) {
			return rc;
		}
	}

	if (ct(buf) == 0) {
		return bErrKeyNotFound;
	}

	memcpy(key, key(lkey(buf)), h->keySize);
	*rec		= rec(lkey(buf));
	h->curBuf	= buf;
	h->curKey	= lkey(buf);
	return bErrOk;
}